

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O1

field_type_t cfgfile::generator::cfg::field_type_from_string(string *type)

{
  size_t __n;
  int iVar1;
  field_type_t fVar2;
  
  __n = type->_M_string_length;
  if (__n == _DAT_0013f3c0) {
    if (__n == 0) {
      return scalar_field_type;
    }
    iVar1 = bcmp((type->_M_dataplus)._M_p,c_scalar_tag_name_abi_cxx11_,__n);
    if (iVar1 == 0) {
      return scalar_field_type;
    }
  }
  if (__n == DAT_0013f3e0) {
    if (__n == 0) {
      return no_value_field_type;
    }
    iVar1 = bcmp((type->_M_dataplus)._M_p,c_no_value_tag_name_abi_cxx11_,__n);
    if (iVar1 == 0) {
      return no_value_field_type;
    }
  }
  if (__n == DAT_0013f400) {
    if (__n == 0) {
      return scalar_vector_field_type;
    }
    iVar1 = bcmp((type->_M_dataplus)._M_p,c_scalar_vector_tag_name_abi_cxx11_,__n);
    if (iVar1 == 0) {
      return scalar_vector_field_type;
    }
  }
  if (__n == DAT_0013f420) {
    if (__n == 0) {
      return vector_of_tags_field_type;
    }
    iVar1 = bcmp((type->_M_dataplus)._M_p,c_vector_of_tags_tag_name_abi_cxx11_,__n);
    if (iVar1 == 0) {
      return vector_of_tags_field_type;
    }
  }
  fVar2 = unknown_field_type;
  if (__n == DAT_0013f440) {
    if (__n == 0) {
      fVar2 = custom_tag_field_type;
    }
    else {
      iVar1 = bcmp((type->_M_dataplus)._M_p,c_custom_tag_name_abi_cxx11_,__n);
      fVar2 = (uint)(iVar1 == 0) * 5;
    }
  }
  return fVar2;
}

Assistant:

static inline field_t::field_type_t field_type_from_string( const std::string & type )
{
	if( type == c_scalar_tag_name )
		return field_t::scalar_field_type;
	else if( type == c_no_value_tag_name )
		return field_t::no_value_field_type;
	else if( type == c_scalar_vector_tag_name )
		return field_t::scalar_vector_field_type;
	else if( type == c_vector_of_tags_tag_name )
		return field_t::vector_of_tags_field_type;
	else if( type == c_custom_tag_name )
		return field_t::custom_tag_field_type;
	else
		return field_t::unknown_field_type;
}